

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[6],wabt::(anonymous_namespace)::ExternalInstanceRef,char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[23],wabt::(anonymous_namespace)::OpenBrace>
          (CWriter *this,char (*t) [6],ExternalInstanceRef *u,char (*args) [7],StackVar *args_1,
          char (*args_2) [23],OpenBrace *args_3)

{
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"if (!",5);
  anon_unknown_0::CWriter::Write((CWriter *)this,(ExternalInstanceRef *)t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,".data[",6);
  anon_unknown_0::CWriter::Write((CWriter *)this,(StackVar *)u);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"].func_tailcallee.fn) ",0x16);
  anon_unknown_0::CWriter::Write((CWriter *)this);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }